

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

Simd128ConstOpnd * __thiscall
IR::Simd128ConstOpnd::New(Simd128ConstOpnd *this,AsmJsSIMDValue value,IRType type,Func *func)

{
  undefined1 *puVar1;
  Simd128ConstOpnd *pSVar2;
  undefined7 in_register_00000009;
  
  pSVar2 = (Simd128ConstOpnd *)
           new<Memory::JitArenaAllocator>
                     (0x20,*(JitArenaAllocator **)CONCAT71(in_register_00000009,type),0x3f1274);
  (pSVar2->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (pSVar2->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (pSVar2->super_Opnd).m_type = TyIllegal;
  (pSVar2->super_Opnd).field_0xb = 0;
  (pSVar2->super_Opnd).m_kind = OpndKindInvalid;
  (pSVar2->super_Opnd).isDeleted = false;
  *(undefined2 *)&(pSVar2->super_Opnd).field_0xe = 0;
  (pSVar2->m_value).field_0.f64[0] = 0.0;
  (pSVar2->m_value).field_0.f64[1] = 0.0;
  (pSVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed940;
  ValueType::ValueType(&(pSVar2->super_Opnd).m_valueType);
  puVar1 = &(pSVar2->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (pSVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed9d0;
  (pSVar2->m_value).field_0.f64[0] = (Type)this;
  (pSVar2->m_value).field_0.i64[1] = value.field_0._0_8_;
  (pSVar2->super_Opnd).m_type = value.field_0._8_1_;
  (pSVar2->super_Opnd).m_kind = OpndKindSimd128Const;
  (pSVar2->super_Opnd).isDeleted = false;
  return pSVar2;
}

Assistant:

Simd128ConstOpnd *
Simd128ConstOpnd::New(AsmJsSIMDValue value, IRType type, Func *func)
{
    Simd128ConstOpnd * simd128ConstOpnd;

    simd128ConstOpnd = JitAnew(func->m_alloc, IR::Simd128ConstOpnd);

    simd128ConstOpnd->m_value = value;
    simd128ConstOpnd->m_type = type;

    simd128ConstOpnd->m_kind = OpndKindSimd128Const;


    return simd128ConstOpnd;
}